

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

void __thiscall Patch::Node::set_old_text(Node *this,optional<Text> *text,uint32_t old_text_size)

{
  bool bVar1;
  Text *this_00;
  Text *pTVar2;
  unique_ptr<Text,_std::default_delete<Text>_> local_28;
  uint32_t local_1c;
  optional<Text> *poStack_18;
  uint32_t old_text_size_local;
  optional<Text> *text_local;
  Node *this_local;
  
  local_1c = old_text_size;
  poStack_18 = text;
  text_local = (optional<Text> *)this;
  bVar1 = ::optional::operator_cast_to_bool((optional *)text);
  if (bVar1) {
    this_00 = (Text *)operator_new(0x38);
    pTVar2 = optional<Text>::operator*(poStack_18);
    Text::Text(this_00,pTVar2);
    std::unique_ptr<Text,std::default_delete<Text>>::unique_ptr<std::default_delete<Text>,void>
              ((unique_ptr<Text,std::default_delete<Text>> *)&local_28,this_00);
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->old_text,&local_28);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr(&local_28);
    this->old_text_size_ = 0;
  }
  else {
    std::unique_ptr<Text,_std::default_delete<Text>_>::operator=(&this->old_text,(nullptr_t)0x0);
    this->old_text_size_ = local_1c;
  }
  return;
}

Assistant:

void set_old_text(optional<Text> &&text, uint32_t old_text_size) {
    if (text) {
      old_text = unique_ptr<Text>{new Text{move(*text)}};
      old_text_size_ = 0;
    } else {
      old_text = nullptr;
      old_text_size_ = old_text_size;
    }
  }